

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.h
# Opt level: O2

void Abc_NodeSetTravIdCurrent(Abc_Obj_t *p)

{
  int Entry;
  int i;
  int in_EDX;
  Vec_Int_t *p_00;
  
  Entry = p->pNtk->nTravIds;
  p_00 = &p->pNtk->vTravIds;
  i = p->Id;
  Vec_IntFillExtra(p_00,i + 1,in_EDX);
  Vec_IntWriteEntry(p_00,i,Entry);
  return;
}

Assistant:

static inline void        Abc_NodeSetTravIdCurrent( Abc_Obj_t * p )         { Abc_NodeSetTravId( p, Abc_ObjNtk(p)->nTravIds );                                      }